

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::InterCallTestCase
          (InterCallTestCase *this,Context *context,char *name,char *desc,StorageType storage,
          int flags,InterCallOperations *ops)

{
  _Rb_tree_header *p_Var1;
  pointer __src;
  pointer __dest;
  TestContext *testCtx;
  long lVar2;
  size_t __n;
  
  testCtx = context->m_testCtx;
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InterCallTestCase_00b2f0f0;
  this->m_storage = storage;
  this->m_invocationGridSize = 0x200;
  this->m_perInvocationSize = 2;
  lVar2 = (long)(ops->m_cmds).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(ops->m_cmds).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dest = std::
           _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
           ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                          *)((lVar2 >> 2) * -0x3333333333333333),(size_t)testCtx);
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_start = __dest;
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_finish = __dest;
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar2 + (long)__dest);
  __src = (ops->m_cmds).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
          ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(ops->m_cmds).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->m_cmds).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n);
  this->m_useAtomic = (bool)((byte)flags & 1);
  this->m_formatInteger = (bool)((byte)flags >> 1 & 1);
  p_Var1 = &(this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_operationPrograms).
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_operationPrograms).
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_operationPrograms).
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_operationResultStorages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_operationResultStorages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_operationResultStorages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

InterCallTestCase::InterCallTestCase (Context& context, const char* name, const char* desc, StorageType storage, int flags, const InterCallOperations& ops)
	: TestCase					(context, name, desc)
	, m_storage					(storage)
	, m_invocationGridSize		(512)
	, m_perInvocationSize		(2)
	, m_cmds					(ops.m_cmds)
	, m_useAtomic				((flags & FLAG_USE_ATOMIC) != 0)
	, m_formatInteger			((flags & FLAG_USE_INT) != 0)
{
}